

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureViewVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::TextureViewVkImpl::TextureViewVkImpl
          (TextureViewVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
          TextureViewDesc *ViewDesc,ITexture *pTexture,ImageViewWrapper *ImgView,bool bIsDefaultView
          )

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  TextureViewBase<Diligent::EngineVkImplTraits>::TextureViewBase
            (&this->super_TextureViewBase<Diligent::EngineVkImplTraits>,pRefCounters,pDevice,
             ViewDesc,pTexture,bIsDefaultView,false);
  (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
  .super_ObjectBase<Diligent::ITextureViewVk>.super_RefCountedObject<Diligent::ITextureViewVk>.
  super_ITextureViewVk.super_ITextureView.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_009214b8;
  (this->m_ImageView).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (ImgView->m_pLogicalDevice).
           super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (ImgView->m_pLogicalDevice).
           super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (ImgView->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_ImageView).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->m_ImageView).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (ImgView->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_ImageView).m_VkObject = ImgView->m_VkObject;
  ImgView->m_VkObject = (VkImageView_T *)0x0;
  return;
}

Assistant:

TextureViewVkImpl::TextureViewVkImpl(IReferenceCounters*                 pRefCounters,
                                     RenderDeviceVkImpl*                 pDevice,
                                     const TextureViewDesc&              ViewDesc,
                                     ITexture*                           pTexture,
                                     VulkanUtilities::ImageViewWrapper&& ImgView,
                                     bool                                bIsDefaultView) :
    // clang-format off
    TTextureViewBase
    {
        pRefCounters,
        pDevice,
        ViewDesc,
        pTexture,
        bIsDefaultView
    },
    m_ImageView{std::move(ImgView)}
// clang-format on
{
}